

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::LexicalCompareVec<unsigned_int,_3>::operator()
          (LexicalCompareVec<unsigned_int,_3> *this,Vector<unsigned_int,_3> *a,
          Vector<unsigned_int,_3> *b)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    uVar1 = uVar2;
    uVar2 = uVar1;
    if (uVar1 == 3) goto LAB_013c270c;
    if (a->m_data[uVar1] < b->m_data[uVar1]) {
      uVar2 = 1;
      goto LAB_013c270c;
    }
    uVar2 = uVar1 + 1;
  } while (a->m_data[uVar1] <= b->m_data[uVar1]);
  uVar2 = 0;
LAB_013c270c:
  return (bool)(uVar1 < 3 & (byte)uVar2);
}

Assistant:

inline bool operator() (const tcu::Vector<T, Size>& a, const tcu::Vector<T, Size>& b) const
	{
		for (int ndx = 0; ndx < Size; ndx++)
		{
			if (a[ndx] < b[ndx])
				return true;
			else if (a[ndx] > b[ndx])
				return false;
		}
		return false;
	}